

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.cpp
# Opt level: O3

void __thiscall
HighsPseudocostInitialization::HighsPseudocostInitialization
          (HighsPseudocostInitialization *this,HighsPseudocost *pscost,HighsInt maxCount,
          HighsPostsolveStack *postsolveStack)

{
  pointer pdVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer piVar12;
  pointer piVar13;
  pointer pdVar14;
  pointer pdVar15;
  pointer pdVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  double dVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  
  memset(this,0,0xf0);
  dVar20 = pscost->inferences_total;
  this->cost_total = pscost->cost_total;
  this->inferences_total = dVar20;
  this->conflict_avg_score = pscost->conflict_avg_score;
  lVar21 = pscost->nsamplestotal;
  if (0 < lVar21) {
    lVar21 = 1;
  }
  this->nsamplestotal = lVar21;
  lVar21 = 1;
  if (pscost->ninferencestotal < 1) {
    lVar21 = pscost->ninferencestotal;
  }
  this->ninferencestotal = lVar21;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->pseudocostup,(long)postsolveStack->origNumCol);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->pseudocostdown,(long)postsolveStack->origNumCol);
  std::vector<int,_std::allocator<int>_>::resize(&this->nsamplesup,(long)postsolveStack->origNumCol)
  ;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->nsamplesdown,(long)postsolveStack->origNumCol);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->inferencesup,(long)postsolveStack->origNumCol);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->inferencesdown,(long)postsolveStack->origNumCol);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ninferencesup,(long)postsolveStack->origNumCol);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ninferencesdown,(long)postsolveStack->origNumCol);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->conflictscoreup,(long)postsolveStack->origNumCol);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->conflictscoredown,(long)postsolveStack->origNumCol);
  pdVar1 = (pscost->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar23 = (ulong)((long)(pscost->pseudocostup).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3;
  iVar22 = (int)uVar23;
  this->conflict_avg_score = this->conflict_avg_score / ((double)iVar22 * pscost->conflict_weight);
  if (iVar22 != 0) {
    piVar2 = (postsolveStack->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->pseudocostdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (pscost->pseudocostdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pscost->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (pscost->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->inferencesup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this->inferencesdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar12 = (this->ninferencesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar13 = (this->ninferencesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar15 = (this->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar16 = (pscost->inferencesup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar17 = (pscost->inferencesdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar18 = (pscost->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar19 = (pscost->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar21 = 0;
    do {
      iVar22 = *(int *)((long)piVar2 + lVar21);
      pdVar3[iVar22] = *(double *)((long)pdVar1 + lVar21 * 2);
      pdVar4[iVar22] = *(double *)((long)pdVar5 + lVar21 * 2);
      iVar24 = *(int *)((long)piVar6 + lVar21);
      if (maxCount <= iVar24) {
        iVar24 = maxCount;
      }
      piVar7[iVar22] = iVar24;
      iVar22 = *(int *)((long)piVar8 + lVar21);
      if (maxCount <= iVar22) {
        iVar22 = maxCount;
      }
      piVar9[*(int *)((long)piVar2 + lVar21)] = iVar22;
      iVar22 = *(int *)((long)piVar2 + lVar21);
      pdVar10[iVar22] = *(double *)((long)pdVar16 + lVar21 * 2);
      pdVar11[iVar22] = *(double *)((long)pdVar17 + lVar21 * 2);
      piVar12[iVar22] = 1;
      piVar13[*(int *)((long)piVar2 + lVar21)] = 1;
      iVar22 = *(int *)((long)piVar2 + lVar21);
      pdVar14[iVar22] = *(double *)((long)pdVar18 + lVar21 * 2) / pscost->conflict_weight;
      pdVar15[iVar22] = *(double *)((long)pdVar19 + lVar21 * 2) / pscost->conflict_weight;
      lVar21 = lVar21 + 4;
    } while ((uVar23 & 0xffffffff) << 2 != lVar21);
  }
  return;
}

Assistant:

HighsPseudocostInitialization::HighsPseudocostInitialization(
    const HighsPseudocost& pscost, HighsInt maxCount,
    const presolve::HighsPostsolveStack& postsolveStack)
    : cost_total(pscost.cost_total),
      inferences_total(pscost.inferences_total),
      conflict_avg_score(pscost.conflict_avg_score),
      nsamplestotal(std::min(int64_t{1}, pscost.nsamplestotal)),
      ninferencestotal(std::min(int64_t{1}, pscost.ninferencestotal)) {
  pseudocostup.resize(postsolveStack.getOrigNumCol());
  pseudocostdown.resize(postsolveStack.getOrigNumCol());
  nsamplesup.resize(postsolveStack.getOrigNumCol());
  nsamplesdown.resize(postsolveStack.getOrigNumCol());
  inferencesup.resize(postsolveStack.getOrigNumCol());
  inferencesdown.resize(postsolveStack.getOrigNumCol());
  ninferencesup.resize(postsolveStack.getOrigNumCol());
  ninferencesdown.resize(postsolveStack.getOrigNumCol());
  conflictscoreup.resize(postsolveStack.getOrigNumCol());
  conflictscoredown.resize(postsolveStack.getOrigNumCol());

  HighsInt ncols = pscost.pseudocostup.size();
  conflict_avg_score /= ncols * pscost.conflict_weight;

  for (HighsInt i = 0; i != ncols; ++i) {
    pseudocostup[postsolveStack.getOrigColIndex(i)] = pscost.pseudocostup[i];
    pseudocostdown[postsolveStack.getOrigColIndex(i)] =
        pscost.pseudocostdown[i];
    nsamplesup[postsolveStack.getOrigColIndex(i)] =
        std::min(maxCount, pscost.nsamplesup[i]);
    nsamplesdown[postsolveStack.getOrigColIndex(i)] =
        std::min(maxCount, pscost.nsamplesdown[i]);
    inferencesup[postsolveStack.getOrigColIndex(i)] = pscost.inferencesup[i];
    inferencesdown[postsolveStack.getOrigColIndex(i)] =
        pscost.inferencesdown[i];
    ninferencesup[postsolveStack.getOrigColIndex(i)] = 1;
    ninferencesdown[postsolveStack.getOrigColIndex(i)] = 1;
    conflictscoreup[postsolveStack.getOrigColIndex(i)] =
        pscost.conflictscoreup[i] / pscost.conflict_weight;
    conflictscoredown[postsolveStack.getOrigColIndex(i)] =
        pscost.conflictscoredown[i] / pscost.conflict_weight;
  }
}